

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O3

void stl_(double *y,int *n,int *np,int *ns,int *nt,int *nl,int *isdeg,int *itdeg,int *ildeg,
         int *nsjump,int *ntjump,int *nljump,int *ni,int *no,double *rw,double *season,double *trend
         ,double *work)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint *n_00;
  int local_58;
  uint local_54;
  int newnp;
  uint *local_48;
  uint local_40;
  uint local_3c;
  int newnl;
  int newns;
  int newnt;
  int userw;
  
  iVar1 = *n;
  iVar2 = *np;
  newns = 0;
  _newnp = np;
  local_48 = (uint *)nt;
  if (0 < (long)iVar1) {
    memset(trend,0,(long)iVar1 << 3);
  }
  uVar8 = iVar1 + iVar2 * 2;
  uVar4 = imax(3,*ns);
  local_3c = uVar4;
  uVar5 = imax(3,*local_48);
  newnl = uVar5;
  local_40 = imax(3,*nl);
  if ((uVar4 & 1) == 0) {
    local_3c = uVar4 | 1;
  }
  if ((uVar5 & 1) == 0) {
    newnl = uVar5 | 1;
  }
  if ((local_40 & 1) == 0) {
    local_40 = local_40 | 1;
  }
  local_54 = uVar8;
  local_48 = (uint *)n;
  local_58 = imax(2,*_newnp);
  lVar6 = (long)(int)local_54;
  _newnp = (int *)0x0;
  n_00 = local_48;
  while( true ) {
    stlstp_(y,(int *)n_00,&local_58,(int *)&local_3c,&newnl,(int *)&local_40,isdeg,itdeg,ildeg,
            nsjump,ntjump,nljump,ni,&newns,rw,season,trend,work);
    puVar3 = local_48;
    if (*no <= (int)_newnp) break;
    uVar4 = *n_00;
    if (0 < (int)uVar4) {
      uVar7 = 0;
      do {
        work[(long)(int)~uVar8 + lVar6 + uVar7 + 1] = trend[uVar7] + season[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    _newnp = (int *)(ulong)((int)_newnp + 1);
    stlrwt_(y,(int *)local_48,work,rw);
    newns = 1;
    n_00 = puVar3;
  }
  if ((*no < 1) && (uVar4 = *n_00, 0 < (int)uVar4)) {
    uVar7 = 0;
    do {
      rw[uVar7] = 1.0;
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  return;
}

Assistant:

void stl_(double *y, int *n, int *np, int *ns, int *nt, int *nl, int *isdeg, int *itdeg, int *
	ildeg, int *nsjump, int *ntjump, int *nljump, int *ni, int *no, double *rw, double *season, double *trend, 
	double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1;

    /* Local variables */
    int i__, k, newnl, newnp, newns, newnt;
	int userw;

/* Arg */
/* 	n                   : length(y) */
/* 	ns, nt, nl          : spans        for `s', `t' and `l' smoother */
/* 	isdeg, itdeg, ildeg : local degree for `s', `t' and `l' smoother */
/* 	nsjump,ntjump,nljump: ........     for `s', `t' and `l' smoother */
/*       ni, no              : number of inner and outer (robust) iterations */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    userw = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	trend[i__] = 0.0;
/* L1: */
    }
/* the three spans must be at least three and odd: */
    newns = imax(3,*ns);
    newnt = imax(3,*nt);
    newnl = imax(3,*nl);
    if (newns % 2 == 0) {
	++newns;
    }
    if (newnt % 2 == 0) {
	++newnt;
    }
    if (newnl % 2 == 0) {
	++newnl;
    }
/* periodicity at least 2: */
    newnp = imax(2,*np);
    k = 0;
/* --- outer loop -- robustnes iterations */
L100:
    stlstp_(&y[1], n, &newnp, &newns, &newnt, &newnl, isdeg, itdeg, ildeg, 
	    nsjump, ntjump, nljump, ni, &userw, &rw[1], &season[1], &trend[1],
	     &work[work_offset]);
    ++k;
    if (k > *no) {
	goto L10;
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	work[i__ + work_dim1] = trend[i__] + season[i__];
/* L3: */
    }
    stlrwt_(&y[1], n, &work[work_dim1 + 1], &rw[1]);
    userw = 1;
    goto L100;
/* --- end Loop */
L10:
/*     robustness weights when there were no robustness iterations: */
    if (*no <= 0) {
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    rw[i__] = 1.0;
/* L15: */
	}
    }
}